

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_out.c
# Opt level: O1

void gdImageGifCtx(gdImagePtr im,gdIOCtxPtr out)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  byte bVar5;
  gdImagePtr im_00;
  uint uVar6;
  char *buf;
  uint uVar7;
  long lVar8;
  GifCtx local_c510;
  
  iVar1 = im->interlace;
  if (im->trueColor == 0) {
    im_00 = (gdImagePtr)0x0;
  }
  else {
    im_00 = gdImageCreatePaletteFromTrueColor(im,1,0x100);
    im = im_00;
    if (im_00 == (gdImagePtr)0x0) {
      return;
    }
  }
  iVar2 = im->colorsTotal;
  uVar7 = 1;
  if ((((2 < iVar2) && (uVar7 = 2, 4 < iVar2)) && (uVar7 = 3, 8 < iVar2)) &&
     (((uVar7 = 4, 0x10 < iVar2 && (uVar7 = 5, 0x20 < iVar2)) &&
      ((uVar7 = 6, 0x40 < iVar2 && (uVar7 = 7, 0x80 < iVar2)))))) {
    uVar7 = (uint)(iVar2 < 0x101) << 3;
  }
  iVar2 = im->sx;
  iVar3 = im->sy;
  iVar4 = im->transparent;
  memset(&local_c510,0,0xc4e0);
  local_c510.in_count = 1;
  local_c510.CountDown = (long)iVar3 * (long)iVar2;
  local_c510.Pass = 0;
  local_c510.curx = 0;
  local_c510.cury = 0;
  buf = "GIF89a";
  if (iVar4 < 0) {
    buf = "GIF87a";
  }
  local_c510.Width = iVar2;
  local_c510.Height = iVar3;
  local_c510.Interlace = iVar1;
  gdPutBuf(buf,6,out);
  gdPutC((uchar)iVar2,out);
  gdPutC((uchar)((uint)iVar2 >> 8),out);
  gdPutC((uchar)iVar3,out);
  gdPutC((uchar)((uint)iVar3 >> 8),out);
  bVar5 = (sbyte)uVar7 - 1;
  gdPutC(bVar5 * '\x10' | bVar5 | 0x80,out);
  gdPutC('\0',out);
  gdPutC('\0',out);
  lVar8 = 0x205;
  do {
    gdPutC(*(uchar *)((long)im + lVar8 * 4 + -0x800),out);
    gdPutC(*(uchar *)((long)im + lVar8 * 4 + -0x400),out);
    gdPutC((uchar)im->red[lVar8 + -5],out);
    iVar1 = (int)lVar8;
    lVar8 = lVar8 + 1;
  } while (iVar1 - 0x204U >> (sbyte)uVar7 == 0);
  if (-1 < iVar4) {
    gdPutC('!',out);
    gdPutC(0xf9,out);
    gdPutC('\x04',out);
    gdPutC('\x01',out);
    gdPutC('\0',out);
    gdPutC('\0',out);
    gdPutC((uchar)iVar4,out);
    gdPutC('\0',out);
  }
  gdPutC(',',out);
  gdPutC('\0',out);
  gdPutC('\0',out);
  gdPutC('\0',out);
  gdPutC('\0',out);
  iVar1 = local_c510.Width;
  gdPutC((uchar)local_c510.Width,out);
  gdPutC((uchar)((uint)iVar1 >> 8),out);
  iVar1 = local_c510.Height;
  gdPutC((uchar)local_c510.Height,out);
  gdPutC((uchar)((uint)iVar1 >> 8),out);
  gdPutC((local_c510.Interlace != 0) << 6,out);
  uVar6 = 2;
  if (2 < uVar7) {
    uVar6 = uVar7;
  }
  gdPutC((uchar)uVar6,out);
  compress(uVar6 + 1,out,im,&local_c510);
  gdPutC('\0',out);
  gdPutC(';',out);
  if (im_00 != (gdImagePtr)0x0) {
    gdImageDestroy(im_00);
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageGifCtx(gdImagePtr im, gdIOCtxPtr out)
{
	gdImagePtr pim = 0, tim = im;
	int interlace, BitsPerPixel;
	interlace = im->interlace;

	if(im->trueColor) {
		/* Expensive, but the only way that produces an
		acceptable result: mix down to a palette
		based temporary image. */
		pim = gdImageCreatePaletteFromTrueColor(im, 1, 256);
		if(!pim) {
			return;
		}
		tim = pim;
	}

	BitsPerPixel = colorstobpp(tim->colorsTotal);

	/* All set, let's do it. */
	GIFEncode(
	    out, tim->sx, tim->sy, interlace, 0, tim->transparent, BitsPerPixel,
	    tim->red, tim->green, tim->blue, tim);

	if(pim) {
		/* Destroy palette based temporary image. */
		gdImageDestroy(	pim);
	}
}